

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::flushTSBuffer(TSMuxer *this)

{
  MuxerManager *this_00;
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 *puVar3;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  uint *local_1a8;
  undefined8 local_1a0;
  uint local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ostringstream ss;
  
  this_00 = (this->super_AbstractMuxer).m_owner;
  if (this_00->m_asyncMode == true) {
    MuxerManager::waitForWriting(this_00);
  }
  iVar1 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[4])();
  if (CONCAT44(extraout_var,iVar1) == -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Can\'t determine size for file ");
    std::operator<<(poVar2,(string *)&this->m_outFileName);
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar3 = 0x69;
    *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
    if (local_1a8 == &local_198) {
      puVar3[6] = local_198;
      puVar3[7] = uStack_194;
      puVar3[8] = uStack_190;
      puVar3[9] = uStack_18c;
    }
    else {
      *(uint **)(puVar3 + 2) = local_1a8;
      *(ulong *)(puVar3 + 6) = CONCAT44(uStack_194,local_198);
    }
    *(undefined8 *)(puVar3 + 4) = local_1a0;
    local_1a0 = 0;
    local_198 = local_198 & 0xffffff00;
    local_1a8 = &local_198;
    __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[3])();
  iVar1 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[2])
                    (this->m_muxFile,(this->m_outFileName)._M_dataplus._M_p,6,0);
  if ((char)iVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"Can\'t reopen file ");
    std::operator<<(poVar2,(string *)&this->m_outFileName);
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar3 = 0x69;
    *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
    if (local_1c8 == &local_1b8) {
      puVar3[6] = local_1b8;
      puVar3[7] = uStack_1b4;
      puVar3[8] = uStack_1b0;
      puVar3[9] = uStack_1ac;
    }
    else {
      *(uint **)(puVar3 + 2) = local_1c8;
      *(ulong *)(puVar3 + 6) = CONCAT44(uStack_1b4,local_1b8);
    }
    *(undefined8 *)(puVar3 + 4) = local_1c0;
    local_1c0 = 0;
    local_1b8 = local_1b8 & 0xffffff00;
    local_1c8 = &local_1b8;
    __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  iVar1 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[5])
                    (this->m_muxFile,this->m_outBuf,(ulong)(uint)this->m_outBufLen);
  if (iVar1 == this->m_outBufLen) {
    if (this->m_outBuf != (uint8_t *)0x0) {
      operator_delete__(this->m_outBuf);
    }
    this->m_outBufLen = 0;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar2 = std::operator<<((ostream *)&ss,"Can\'t write last data block to file ");
  std::operator<<(poVar2,(string *)&this->m_outFileName);
  puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar3 = 0x69;
  *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
  if (local_1e8 == &local_1d8) {
    puVar3[6] = local_1d8;
    puVar3[7] = uStack_1d4;
    puVar3[8] = uStack_1d0;
    puVar3[9] = uStack_1cc;
  }
  else {
    *(uint **)(puVar3 + 2) = local_1e8;
    *(ulong *)(puVar3 + 6) = CONCAT44(uStack_1d4,local_1d8);
  }
  *(undefined8 *)(puVar3 + 4) = local_1e0;
  local_1d8 = local_1d8 & 0xffffff00;
  __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void TSMuxer::flushTSBuffer()
{
    if (m_owner->isAsyncMode())
        m_owner->waitForWriting();

    const int64_t fileSize = m_muxFile->size();
    if (fileSize == -1)
        THROW(ERR_FILE_COMMON, "Can't determine size for file " << m_outFileName)
    m_muxFile->close();

    if (!m_muxFile->open(m_outFileName.c_str(), File::ofWrite + File::ofAppend))
        THROW(ERR_FILE_COMMON, "Can't reopen file " << m_outFileName)

    if (writeOutFile(m_outBuf, m_outBufLen) != m_outBufLen)
        THROW(ERR_FILE_COMMON, "Can't write last data block to file " << m_outFileName)
    delete[] m_outBuf;
    m_outBufLen = 0;
}